

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHelper.cpp
# Opt level: O2

void __thiscall
phpconvert::StringHelper::split
          (StringHelper *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out,string *delim,string *source)

{
  undefined1 auVar1 [16];
  is_any_ofF<char> iStack_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(out);
  auVar1 = std::__cxx11::string::find((string *)source,(ulong)delim);
  if (auVar1._0_8_ != -1) {
    boost::algorithm::is_any_of<std::__cxx11::string>(&iStack_38,(algorithm *)delim,auVar1._8_8_);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
              (out,source,&iStack_38,token_compress_on);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&iStack_38);
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(out,source);
  return;
}

Assistant:

void StringHelper::split(vector<string>& out, const string& delim, const string& source) {
	out.clear();
	if (source.find(delim) != string::npos)
		boost::split(out, source, is_any_of(delim), token_compress_on);
	else
		out.push_back(source);
}